

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.h
# Opt level: O2

string * __thiscall
wallet::SQLiteDatabase::Filename_abi_cxx11_(string *__return_storage_ptr__,SQLiteDatabase *this)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,&this->m_file_path);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string Filename() override { return m_file_path; }